

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btor2parser.c
# Opt level: O0

int32_t parse_slice_bfr(Btor2Parser *bfr,Btor2Line *l)

{
  int32_t iVar1;
  Btor2Parser *in_RSI;
  Btor2Parser *in_RDI;
  uint32_t lower;
  undefined4 in_stack_ffffffffffffffe0;
  uint in_stack_ffffffffffffffe4;
  int32_t local_4;
  
  iVar1 = parse_ext_bfr(in_RSI,(Btor2Line *)
                               CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
  if (iVar1 == 0) {
    local_4 = 0;
  }
  else {
    iVar1 = getc_bfr((Btor2Parser *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    if (iVar1 == 0x20) {
      iVar1 = parse_pos_number_bfr
                        (in_RSI,(uint32_t *)
                                CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
      if (iVar1 == 0) {
        local_4 = 0;
      }
      else {
        *(ulong *)(in_RSI[1].error + 0x10) = (ulong)in_stack_ffffffffffffffe4;
        if (*(long *)(in_RSI[1].error + 8) < (long)(ulong)in_stack_ffffffffffffffe4) {
          local_4 = perr_bfr(in_RDI,"lower has to be less than or equal to upper");
        }
        else {
          local_4 = 1;
        }
      }
    }
    else {
      local_4 = perr_bfr(in_RDI,"expected space after second argument");
    }
  }
  return local_4;
}

Assistant:

static int32_t
parse_slice_bfr (Btor2Parser *bfr, Btor2Line *l)
{
  uint32_t lower;
  if (!parse_ext_bfr (bfr, l)) return 0;
  if (getc_bfr (bfr) != ' ')
    return perr_bfr (bfr, "expected space after second argument");
  if (!parse_pos_number_bfr (bfr, &lower)) return 0;
  l->args[2] = lower;
  if (lower > l->args[1])
    return perr_bfr (bfr, "lower has to be less than or equal to upper");
  return 1;
}